

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O1

char * __thiscall IrSim::print1(IrSim *this,C_IC *i)

{
  size_t __maxlen;
  char *__s;
  char *__format;
  string local_48;
  
  __maxlen = this->PBSIZE;
  __s = this->pb;
  __format = icFmt[i->kind];
  Operand::str_abi_cxx11_(&local_48,&i->target);
  snprintf(__s,__maxlen,__format,local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return this->pb;
}

Assistant:

const char *IrSim::print1(C_IC &i) const {
    snprintf(pb, PBSIZE, icFmt[i.kind], i[0].str().c_str());
    return pb;
}